

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O1

bool __thiscall despot::Pocman::SmellFood(Pocman *this,PocmanState *pocstate)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  bool bVar7;
  int local_38;
  int local_34;
  
  despot::Coord::Coord((Coord *)&local_38);
  iVar1 = this->smell_range_;
  iVar5 = -iVar1;
  bVar7 = -1 < iVar1;
  if (bVar7) {
    do {
      _local_38 = CONCAT44(-iVar1,iVar5);
      if (SBORROW4(this->smell_range_,-iVar1) == this->smell_range_ + iVar1 < 0) {
        do {
          lVar2 = despot::operator+(&pocstate->pocman_pos,(Coord *)&local_38);
          if ((((-1 < (int)lVar2) && (-1 < lVar2)) && ((int)lVar2 < (this->maze_).xsize_)) &&
             ((int)((ulong)lVar2 >> 0x20) < (this->maze_).ysize_)) {
            uVar3 = despot::operator+(&pocstate->pocman_pos,(Coord *)&local_38);
            uVar4 = (ulong)((int)((ulong)uVar3 >> 0x20) * (this->maze_).xsize_ + (int)uVar3);
            uVar6 = uVar4 + 0x3f;
            if (-1 < (long)uVar4) {
              uVar6 = uVar4;
            }
            if (((pocstate->food).super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [((long)uVar6 >> 6) +
                  (ulong)((uVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff]
                 >> (uVar4 & 0x3f) & 1) != 0) {
              return bVar7;
            }
          }
          iVar5 = local_34;
          _local_38 = CONCAT44(local_34 + 1,local_38);
        } while (iVar5 < this->smell_range_);
      }
      iVar5 = local_38 + 1;
      iVar1 = this->smell_range_;
      bVar7 = local_38 < iVar1;
    } while (local_38 < iVar1);
  }
  return bVar7;
}

Assistant:

bool Pocman::SmellFood(const PocmanState& pocstate) const {
	Coord smellPos;
	for (smellPos.x = -smell_range_; smellPos.x <= smell_range_; smellPos.x++)
		for (smellPos.y = -smell_range_; smellPos.y <= smell_range_; smellPos.y++)
			if (maze_.Inside(pocstate.pocman_pos + smellPos)
				&& pocstate.food[maze_.Index(pocstate.pocman_pos + smellPos)])
				return true;
	return false;
}